

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::data<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  Name name_00;
  bool bVar1;
  size_t sVar2;
  Name *pNVar3;
  Err *pEVar4;
  Ok *pOVar5;
  vector<char,_std::allocator<char>_> *data;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  Ok local_439;
  Err local_438;
  Err *local_418;
  Err *err_5;
  size_t local_408;
  char *pcStack_400;
  undefined1 local_3f8 [8];
  Result<wasm::Ok> _val_5;
  string local_3c8;
  Err local_3a8;
  Err local_388;
  Err *local_368;
  Err *err_4;
  Result<std::vector<char,_std::allocator<char>_>_> _val_4;
  Result<std::vector<char,_std::allocator<char>_>_> str;
  string local_308;
  Err local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  Err local_2a0;
  Err local_280;
  Err *local_260;
  Err *err_3;
  Result<wasm::Ok> _val_3;
  Result<wasm::Ok> offsetExpr;
  Err *err_2;
  MaybeResult<wasm::Ok> _val_2;
  string local_1b0;
  Err local_190;
  Err local_170;
  Err *local_150;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> e;
  _Optional_base<wasm::Ok,_true,_true> local_e6;
  uint local_e4;
  undefined1 local_e0 [2];
  optional<wasm::Ok> offset;
  Err *err;
  undefined1 local_a8 [8];
  MaybeResult<wasm::Ok> _val;
  MaybeResult<wasm::Ok> mem;
  optional<wasm::Name> id;
  Name name;
  Index local_20;
  size_t pos;
  ParseDeclsCtx *ctx_local;
  
  sVar2 = Lexer::getPos(&ctx->in);
  bVar6 = sv("data",4);
  bVar1 = Lexer::takeSExprStart(&ctx->in,bVar6);
  if (!bVar1) {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_engaged);
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),&ctx->in);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  if (bVar1) {
    pNVar3 = std::optional<wasm::Name>::operator*
                       ((optional<wasm::Name> *)
                        ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    wasm::Name::operator=
              ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,pNVar3);
  }
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
  maybeMemuse<wasm::WATParser::ParseDeclsCtx>
            ((MaybeResult<wasm::Ok> *)__return_storage_ptr___00,ctx);
  MaybeResult<wasm::Ok>::MaybeResult
            ((MaybeResult<wasm::Ok> *)local_a8,(MaybeResult<wasm::Ok> *)__return_storage_ptr___00);
  pEVar4 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)local_a8);
  if (pEVar4 != (Err *)0x0) {
    wasm::Err::Err((Err *)local_e0,pEVar4);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,(Err *)local_e0);
    wasm::Err::~Err((Err *)local_e0);
  }
  local_e4 = (uint)(pEVar4 != (Err *)0x0);
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_a8);
  if (local_e4 != 0) goto LAB_0232f87d;
  std::optional<wasm::Ok>::optional((optional<wasm::Ok> *)&local_e6);
  bVar6 = sv("offset",6);
  bVar1 = Lexer::takeSExprStart(&ctx->in,bVar6);
  if (bVar1) {
    expr<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)&err_1,
               (Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    local_150 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
    bVar1 = local_150 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_170,local_150);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_170);
      wasm::Err::~Err(&local_170);
    }
    local_e4 = (uint)bVar1;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
    if (local_e4 == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        pOVar5 = Result<wasm::Ok>::operator*
                           ((Result<wasm::Ok> *)
                            ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        std::optional<wasm::Ok>::operator=((optional<wasm::Ok> *)&local_e6,pOVar5);
        local_e4 = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"expected end of offset expression",
                   (allocator<char> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x27));
        Lexer::err(&local_190,&ctx->in,&local_1b0);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_190);
        wasm::Err::~Err(&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x27));
        local_e4 = 1;
      }
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
joined_r0x0232efdd:
    if (local_e4 != 0) goto LAB_0232f87d;
  }
  else {
    bVar1 = Lexer::takeLParen(&ctx->in);
    if (bVar1) {
      instr<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)&err_2,ctx);
      pEVar4 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_2);
      if (pEVar4 != (Err *)0x0) {
        wasm::Err::Err((Err *)((long)&offsetExpr.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar4);
        MaybeResult<wasm::Ok>::MaybeResult
                  (__return_storage_ptr__,
                   (Err *)((long)&offsetExpr.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        wasm::Err::~Err((Err *)((long)&offsetExpr.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
      local_e4 = (uint)(pEVar4 != (Err *)0x0);
      MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_2);
      if (local_e4 != 0) goto LAB_0232f87d;
      NullInstrParserCtx::makeExpr
                ((Result<wasm::Ok> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                 (NullInstrParserCtx *)ctx);
      Result<wasm::Ok>::Result
                ((Result<wasm::Ok> *)&err_3,
                 (Result<wasm::Ok> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      local_260 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_3);
      bVar1 = local_260 != (Err *)0x0;
      if (bVar1) {
        wasm::Err::Err(&local_280,local_260);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_280);
        wasm::Err::~Err(&local_280);
      }
      local_e4 = (uint)bVar1;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_3);
      if (local_e4 == 0) {
        pOVar5 = Result<wasm::Ok>::operator*
                           ((Result<wasm::Ok> *)
                            ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        std::optional<wasm::Ok>::operator=((optional<wasm::Ok> *)&local_e6,pOVar5);
        bVar1 = Lexer::takeRParen(&ctx->in);
        if (bVar1) {
          local_e4 = 0;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c0,"expected end of offset instruction",&local_2c1);
          Lexer::err(&local_2a0,&ctx->in,&local_2c0);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2a0);
          wasm::Err::~Err(&local_2a0);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::allocator<char>::~allocator(&local_2c1);
          local_e4 = 1;
        }
      }
      Result<wasm::Ok>::~Result
                ((Result<wasm::Ok> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      goto joined_r0x0232efdd;
    }
  }
  bVar1 = wasm::MaybeResult::operator_cast_to_bool
                    ((MaybeResult *)
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  if ((!bVar1) || (bVar1 = std::optional::operator_cast_to_bool((optional *)&local_e6), bVar1)) {
    datastring<wasm::WATParser::ParseDeclsCtx>
              ((Result<std::vector<char,_std::allocator<char>_>_> *)
               ((long)&_val_4.val.
                       super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                       super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),ctx);
    Result<std::vector<char,_std::allocator<char>_>_>::Result
              ((Result<std::vector<char,_std::allocator<char>_>_> *)&err_4,
               (Result<std::vector<char,_std::allocator<char>_>_> *)
               ((long)&_val_4.val.
                       super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                       super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
    local_368 = Result<std::vector<char,_std::allocator<char>_>_>::getErr
                          ((Result<std::vector<char,_std::allocator<char>_>_> *)&err_4);
    bVar1 = local_368 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_388,local_368);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_388);
      wasm::Err::~Err(&local_388);
    }
    local_e4 = (uint)bVar1;
    Result<std::vector<char,_std::allocator<char>_>_>::~Result
              ((Result<std::vector<char,_std::allocator<char>_>_> *)&err_4);
    if (local_e4 == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        local_408 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._16_8_;
        pcStack_400 = (char *)name.super_IString.str._M_len;
        pOVar5 = MaybeResult<wasm::Ok>::getPtr
                           ((MaybeResult<wasm::Ok> *)
                            ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20))
        ;
        err_5._6_2_ = local_e6._M_payload.super__Optional_payload_base<wasm::Ok>;
        data = Result<std::vector<char,_std::allocator<char>_>_>::operator*
                         ((Result<std::vector<char,_std::allocator<char>_>_> *)
                          ((long)&_val_4.val.
                                  super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                  .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                  super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                  super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                  super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
        local_20 = (Index)sVar2;
        name_00.super_IString.str._M_str = pcStack_400;
        name_00.super_IString.str._M_len = local_408;
        ParseDeclsCtx::addData
                  ((Result<wasm::Ok> *)local_3f8,ctx,name_00,pOVar5,(optional<wasm::Ok>)err_5._6_2_,
                   data,local_20);
        local_418 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_3f8);
        bVar1 = local_418 != (Err *)0x0;
        if (bVar1) {
          wasm::Err::Err(&local_438,local_418);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_438);
          wasm::Err::~Err(&local_438);
        }
        local_e4 = (uint)bVar1;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_3f8);
        if (local_e4 == 0) {
          MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_439);
          local_e4 = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"expected end of data segment",
                   (allocator<char> *)
                   ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
        Lexer::err(&local_3a8,&ctx->in,&local_3c8);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3a8);
        wasm::Err::~Err(&local_3a8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
        local_e4 = 1;
      }
    }
    Result<std::vector<char,_std::allocator<char>_>_>::~Result
              ((Result<std::vector<char,_std::allocator<char>_>_> *)
               ((long)&_val_4.val.
                       super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                       super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"expected offset for active segment",
               (allocator<char> *)
               ((long)&str.val.
                       super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                       super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x27));
    Lexer::err(&local_2e8,&ctx->in,&local_308);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2e8);
    wasm::Err::~Err(&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&str.val.
                       super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                       super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x27));
    local_e4 = 1;
  }
LAB_0232f87d:
  MaybeResult<wasm::Ok>::~MaybeResult
            ((MaybeResult<wasm::Ok> *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> data(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("data"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto mem = maybeMemuse(ctx);
  CHECK_ERR(mem);

  std::optional<typename Ctx::ExprT> offset;
  if (ctx.in.takeSExprStart("offset"sv)) {
    auto e = expr(ctx);
    CHECK_ERR(e);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset expression");
    }
    offset = *e;
  } else if (ctx.in.takeLParen()) {
    CHECK_ERR(instr(ctx));
    auto offsetExpr = ctx.makeExpr();
    CHECK_ERR(offsetExpr);
    offset = *offsetExpr;
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset instruction");
    }
  }

  if (mem && !offset) {
    return ctx.in.err("expected offset for active segment");
  }

  auto str = datastring(ctx);
  CHECK_ERR(str);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of data segment");
  }

  CHECK_ERR(ctx.addData(name, mem.getPtr(), offset, std::move(*str), pos));

  return Ok{};
}